

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.cpp
# Opt level: O0

void pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>::InsertExampleElement
               (TPZGeoMesh *gmesh,int matid,TPZVec<double> *lowercorner,TPZVec<double> *size)

{
  MElementType MVar1;
  TPZAdmChunkVector<TPZGeoEl_*,_10> *this;
  int64_t iVar2;
  TPZGeoEl *pTVar3;
  TPZGeoElRefLess<pzgeom::TPZWavyLine> *this_00;
  double *pdVar4;
  uint in_ESI;
  TPZGeoMesh *in_RDI;
  int64_t index;
  TPZManVector<double,_3> wavedir;
  TPZGeoElRefPattern<pzgeom::TPZWavyLine> *gelwave;
  int i;
  int NNodes;
  TPZGeoEl *gel;
  TPZManVector<long,_3> nodeindexes;
  int64_t elid;
  TPZVec<double> *in_stack_00000128;
  TPZVec<double> *in_stack_00000130;
  int in_stack_0000013c;
  TPZGeoMesh *in_stack_00000140;
  int64_t in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  int64_t in_stack_ffffffffffffff08;
  TPZManVector<long,_3> *in_stack_ffffffffffffff10;
  TPZGeoMesh *in_stack_ffffffffffffff18;
  TPZManVector<double,_3> *in_stack_ffffffffffffff20;
  TPZGeoEl *nodeindices;
  TPZGeoElRefPattern<pzgeom::TPZWavyLine> *in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff44;
  TPZVec<double> *in_stack_ffffffffffffff48;
  TPZWavyLine *in_stack_ffffffffffffff50;
  int local_7c;
  TPZVec<long> local_60;
  long local_28;
  uint local_c;
  TPZGeoMesh *local_8;
  
  local_c = in_ESI;
  local_8 = in_RDI;
  TPZGeoQuad::InsertExampleElement
            (in_stack_00000140,in_stack_0000013c,in_stack_00000130,in_stack_00000128);
  this = TPZGeoMesh::ElementVec(local_8);
  iVar2 = TPZChunkVector<TPZGeoEl_*,_10>::NElements(&this->super_TPZChunkVector<TPZGeoEl_*,_10>);
  local_28 = iVar2 + -1;
  TPZManVector<long,_3>::TPZManVector(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  pTVar3 = TPZGeoMesh::Element((TPZGeoMesh *)
                               CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                               in_stack_fffffffffffffee8);
  nodeindices = pTVar3;
  for (local_7c = 0; local_7c < 4; local_7c = local_7c + 1) {
    in_stack_ffffffffffffff20 =
         (TPZManVector<double,_3> *)(**(code **)(*(long *)pTVar3 + 0xa8))(pTVar3,local_7c);
    in_stack_ffffffffffffff18 = (TPZGeoMesh *)TPZVec<long>::operator[](&local_60,(long)local_7c);
    (in_stack_ffffffffffffff18->super_TPZSavable)._vptr_TPZSavable =
         (_func_int **)in_stack_ffffffffffffff20;
  }
  this_00 = (TPZGeoElRefLess<pzgeom::TPZWavyLine> *)operator_new(0x108);
  TPZGeoElRefPattern<pzgeom::TPZWavyLine>::TPZGeoElRefPattern
            (in_stack_ffffffffffffff30,(TPZVec<long> *)nodeindices,
             (int)((ulong)in_stack_ffffffffffffff20 >> 0x20),in_stack_ffffffffffffff18);
  TPZManVector<double,_3>::TPZManVector
            (in_stack_ffffffffffffff20,(int64_t)in_stack_ffffffffffffff18,(double *)this_00);
  pdVar4 = TPZVec<double>::operator[]((TPZVec<double> *)&stack0xffffffffffffff40,0);
  *pdVar4 = 0.0;
  TPZGeoElRefLess<pzgeom::TPZWavyLine>::Geom(this_00);
  TPZWavyLine::SetData
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff44);
  if (pTVar3 != (TPZGeoEl *)0x0) {
    (**(code **)(*(long *)pTVar3 + 8))();
  }
  MVar1 = pztopology::TPZQuadrilateral::Type();
  (*(local_8->super_TPZSavable)._vptr_TPZSavable[0xd])
            (local_8,(ulong)MVar1,&local_60,(ulong)local_c,&stack0xffffffffffffff30);
  TPZManVector<double,_3>::~TPZManVector
            ((TPZManVector<double,_3> *)CONCAT44(MVar1,in_stack_fffffffffffffef0));
  TPZManVector<long,_3>::~TPZManVector
            ((TPZManVector<long,_3> *)CONCAT44(MVar1,in_stack_fffffffffffffef0));
  return;
}

Assistant:

void pzgeom::TPZGeoBlend<TGeo>::InsertExampleElement(TPZGeoMesh &gmesh, int matid, TPZVec<REAL> &lowercorner, TPZVec<REAL> &size)
{
    
    TGeo::InsertExampleElement(gmesh, -1, lowercorner, size);
    int64_t elid = gmesh.ElementVec().NElements()-1;
    TPZManVector<int64_t,3> nodeindexes(8);
    TPZGeoEl *gel = gmesh.Element(elid);
    int NNodes = TGeo::NCornerNodes;
    for (int i=0; i<NNodes; i++) {
        nodeindexes[i] = gel->NodeIndex(i);
    }
    TPZGeoElRefPattern<TPZWavyLine> *gelwave = new TPZGeoElRefPattern<TPZWavyLine>(nodeindexes,matid,gmesh);
    TPZManVector<REAL,3> wavedir(3,0.02);
    wavedir[0] = 0.;
    gelwave->Geom().SetData(wavedir, 2);
    delete gel;
    int64_t index;
    gmesh.CreateGeoBlendElement(TGeo::Type(), nodeindexes, matid, index);
}